

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

uint64_t lzma_stream_encoder_mt_memusage(lzma_mt *options)

{
  lzma_ret lVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  long lVar5;
  uint64_t total_memusage;
  uint64_t outq_memusage;
  uint64_t filters_memusage;
  uint64_t inbuf_memusage;
  uint64_t outbuf_size_max;
  uint64_t block_size;
  lzma_filter *filters;
  lzma_options_easy easy;
  lzma_mt *options_local;
  
  easy.opt_lzma.reserved_ptr2 = options;
  lVar1 = get_options(options,(lzma_options_easy *)&filters,(lzma_filter **)&block_size,
                      &outbuf_size_max,&inbuf_memusage);
  if (lVar1 == LZMA_OK) {
    uVar2 = *(uint *)((long)easy.opt_lzma.reserved_ptr2 + 4) * outbuf_size_max;
    uVar3 = lzma_raw_encoder_memusage((lzma_filter *)block_size);
    if (uVar3 == 0xffffffffffffffff) {
      options_local = (lzma_mt *)0xffffffffffffffff;
    }
    else {
      uVar4 = *(uint *)((long)easy.opt_lzma.reserved_ptr2 + 4) * uVar3;
      uVar3 = lzma_outq_memusage(inbuf_memusage,*(uint32_t *)((long)easy.opt_lzma.reserved_ptr2 + 4)
                                );
      if (uVar3 == 0xffffffffffffffff) {
        options_local = (lzma_mt *)0xffffffffffffffff;
      }
      else {
        lVar5 = (ulong)*(uint *)((long)easy.opt_lzma.reserved_ptr2 + 4) * 0x1c0 + 0x81c0;
        if (-lVar5 - 1U < uVar2) {
          options_local = (lzma_mt *)0xffffffffffffffff;
        }
        else {
          lVar5 = uVar2 + lVar5;
          if (-lVar5 - 1U < uVar4) {
            options_local = (lzma_mt *)0xffffffffffffffff;
          }
          else {
            lVar5 = uVar4 + lVar5;
            if (-lVar5 - 1U < uVar3) {
              options_local = (lzma_mt *)0xffffffffffffffff;
            }
            else {
              options_local = (lzma_mt *)(lVar5 + uVar3);
            }
          }
        }
      }
    }
  }
  else {
    options_local = (lzma_mt *)0xffffffffffffffff;
  }
  return (uint64_t)options_local;
}

Assistant:

extern LZMA_API(uint64_t)
lzma_stream_encoder_mt_memusage(const lzma_mt *options)
{
	lzma_options_easy easy;
	const lzma_filter *filters;
	uint64_t block_size;
	uint64_t outbuf_size_max;

	if (get_options(options, &easy, &filters, &block_size,
			&outbuf_size_max) != LZMA_OK)
		return UINT64_MAX;

	// Memory usage of the input buffers
	const uint64_t inbuf_memusage = options->threads * block_size;

	// Memory usage of the filter encoders
	uint64_t filters_memusage = lzma_raw_encoder_memusage(filters);
	if (filters_memusage == UINT64_MAX)
		return UINT64_MAX;

	filters_memusage *= options->threads;

	// Memory usage of the output queue
	const uint64_t outq_memusage = lzma_outq_memusage(
			outbuf_size_max, options->threads);
	if (outq_memusage == UINT64_MAX)
		return UINT64_MAX;

	// Sum them with overflow checking.
	uint64_t total_memusage = LZMA_MEMUSAGE_BASE
			+ sizeof(lzma_stream_coder)
			+ options->threads * sizeof(worker_thread);

	if (UINT64_MAX - total_memusage < inbuf_memusage)
		return UINT64_MAX;

	total_memusage += inbuf_memusage;

	if (UINT64_MAX - total_memusage < filters_memusage)
		return UINT64_MAX;

	total_memusage += filters_memusage;

	if (UINT64_MAX - total_memusage < outq_memusage)
		return UINT64_MAX;

	return total_memusage + outq_memusage;
}